

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arenas_create_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  uint ind;
  ctl_arena_t *pcVar1;
  ulong uVar2;
  ctl_arenas_t *pcVar3;
  undefined8 in_RAX;
  ctl_arena_t *pcVar4;
  ctl_arena_t *pcVar5;
  arena_t *paVar6;
  size_t __n;
  int iVar7;
  extent_hooks_t *extent_hooks;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  pcVar3 = ctl_arenas;
  iVar7 = 0x16;
  if (newp == (void *)0x0) {
    extent_hooks = &extent_hooks_default;
  }
  else {
    if (newlen != 8) goto LAB_00119c56;
    extent_hooks = *newp;
  }
  pcVar5 = (ctl_arenas->destroyed).qlh_first;
  if ((pcVar5 == (ctl_arena_t *)0x0) ||
     (pcVar4 = (pcVar5->destroyed_link).qre_prev, pcVar4 == (ctl_arena_t *)0x0)) {
    pcVar4 = (ctl_arena_t *)&ctl_arenas->narenas;
  }
  else {
    if (pcVar5 == pcVar4) {
      pcVar5 = (pcVar5->destroyed_link).qre_next;
      (ctl_arenas->destroyed).qlh_first = pcVar5;
    }
    if (pcVar5 == pcVar4) {
      (pcVar3->destroyed).qlh_first = (ctl_arena_t *)0x0;
    }
    else {
      pcVar5 = (pcVar4->destroyed_link).qre_next;
      pcVar1 = (pcVar4->destroyed_link).qre_prev;
      (pcVar1->destroyed_link).qre_next = pcVar5;
      (pcVar5->destroyed_link).qre_prev = pcVar1;
      (pcVar4->destroyed_link).qre_next = pcVar4;
      (pcVar4->destroyed_link).qre_prev = pcVar4;
    }
  }
  ind = pcVar4->arena_ind;
  pcVar5 = arenas_i_impl(tsd,(ulong)ind,false,true);
  iVar7 = 0xb;
  if (pcVar5 != (ctl_arena_t *)0x0) {
    paVar6 = arena_init((tsdn_t *)tsd,ind,extent_hooks);
    if (paVar6 != (arena_t *)0x0) {
      if (ind == ctl_arenas->narenas) {
        ctl_arenas->narenas = ind + 1;
      }
      uStack_38 = CONCAT44(ind,(undefined4)uStack_38);
      if ((ind != 0xffffffff) && (iVar7 = 0, oldlenp != (size_t *)0x0 && oldp != (void *)0x0)) {
        uVar2 = *oldlenp;
        if (uVar2 == 4) {
          *(uint *)oldp = ind;
        }
        else {
          __n = 4;
          if (uVar2 < 4) {
            __n = uVar2;
          }
          memcpy(oldp,(void *)((long)&uStack_38 + 4),__n);
          iVar7 = 0x16;
        }
      }
    }
  }
LAB_00119c56:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return iVar7;
}

Assistant:

static int
arenas_create_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	extent_hooks_t *extent_hooks;
	unsigned arena_ind;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);

	extent_hooks = (extent_hooks_t *)&extent_hooks_default;
	WRITE(extent_hooks, extent_hooks_t *);
	if ((arena_ind = ctl_arena_init(tsd, extent_hooks)) == UINT_MAX) {
		ret = EAGAIN;
		goto label_return;
	}
	READ(arena_ind, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}